

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastInstancesIterator::
init<Kernel::TypedTermList>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  int iVar1;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> VStack_38;
  
  this->_retrieveSubstitution = retrieveSubstitution;
  iVar1 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar1,0);
  if (SUB41(iVar1,0) == false) {
    Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::getEmpty();
  }
  else {
    (*root->_vptr_Node[8])(&VStack_38,root);
  }
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::operator=
            (&this->_ldIterator,&VStack_38);
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator(&VStack_38);
  this->_root = root;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::reset(&this->_subst);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastInstancesIterator::init<Kernel::TypedTermList>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node*,Kernel::TypedTermList,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
  if (this->_inLeaf == true) {
    Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (&(this->_subst)._derefBindings);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }